

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O1

double declaration(bool is_const)

{
  bool bVar1;
  runtime_error *prVar2;
  double value;
  Token t2;
  string name;
  Token t;
  undefined1 local_e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Token local_50;
  
  Token_stream::get(&local_50,&ts);
  if (local_50.kind != 'a') {
    local_e0._0_8_ = local_e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"name expected in declaration","");
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,(string *)local_e0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_50.name._M_dataplus._M_p,
             local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
  bVar1 = Symbol_table::is_declared(&st,&local_b0);
  if (!bVar1) {
    Token_stream::get((Token *)local_e0,&ts);
    if (local_e0[0] == (string)0x3d) {
      value = expression();
      Symbol_table::define_name(&st,&local_b0,value,is_const);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._16_8_ != &local_c0) {
        operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
        operator_delete(local_50.name._M_dataplus._M_p,
                        local_50.name.field_2._M_allocated_capacity + 1);
      }
      return value;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"= missing in declaration of ","");
    std::operator+(&local_90,&local_70,&local_b0);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,(string *)&local_90);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," declared twice","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &local_b0,&local_90);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,(string *)local_e0);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double declaration(bool is_const = false)
{
	Token t = ts.get();
	if (t.kind != name)
		error("name expected in declaration");
	string name = t.name;
	if (st.is_declared(name))
		error(name, " declared twice");
	Token t2 = ts.get();
	if (t2.kind != '=')
		error("= missing in declaration of ", name);
	double d = expression();
	st.define_name(name, d, is_const);
	return d;
}